

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diners.c
# Opt level: O0

dining_policy_t get_dining_policy(void)

{
  int iVar1;
  char *__s1;
  char *dining_policy;
  
  __s1 = getenv("DINING_POLICY");
  if (__s1 == (char *)0x0) {
    dining_policy._4_4_ = NO_FORK_REORDERING;
  }
  else {
    iVar1 = strcmp(__s1,"avoid_deadlock");
    if (iVar1 == 0) {
      dining_policy._4_4_ = FORK_REORDERING;
    }
    else {
      dining_policy._4_4_ = NO_FORK_REORDERING;
    }
  }
  return dining_policy._4_4_;
}

Assistant:

enum dining_policy_t get_dining_policy()
{
    char *dining_policy = getenv("DINING_POLICY");
    if (dining_policy == NULL)
        return NO_FORK_REORDERING;

    if (strcmp(dining_policy, "avoid_deadlock") == 0)
        return FORK_REORDERING;

    return NO_FORK_REORDERING;
}